

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void __thiscall FSlide::SlideTraverse(FSlide *this,DVector2 *start,DVector2 *end)

{
  double *pdVar1;
  AActor *actor;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  intercept_t *piVar5;
  bool bVar6;
  double dVar7;
  bool good;
  double savedz;
  TFlags<ActorFlag,_unsigned_int> local_140;
  TFlags<ActorFlag3,_unsigned_int> local_13c;
  TVector2<double> local_138;
  undefined1 local_128 [8];
  DVector3 pos;
  line_t *li;
  intercept_t *in;
  FPathTraverse it;
  FLineOpening open;
  DVector2 *end_local;
  DVector2 *start_local;
  FSlide *this_local;
  
  FLineOpening::FLineOpening((FLineOpening *)&it.count);
  FPathTraverse::FPathTraverse((FPathTraverse *)&in,start->X,start->Y,end->X,end->Y,1,0.0);
  do {
    while( true ) {
      while( true ) {
        piVar5 = FPathTraverse::Next((FPathTraverse *)&in);
        if (piVar5 == (intercept_t *)0x0) goto LAB_006754cc;
        if ((piVar5->isaline & 1U) != 0) break;
        Printf("PTR_SlideTraverse: not a line?");
      }
      pos.Z = (double)(piVar5->d).line;
      if (((((line_t *)pos.Z)->flags & 4) == 0) ||
         (((line_t *)pos.Z)->backsector == (sector_t *)0x0)) break;
      if (((((line_t *)pos.Z)->flags & 0x8001) != 0) ||
         (((((line_t *)pos.Z)->flags & 0x4000) != 0 && (this->slidemo->player != (player_t *)0x0))))
      goto LAB_00675468;
      bVar6 = false;
      if ((((line_t *)pos.Z)->flags & 2) != 0) {
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  (&local_13c,
                   (int)this->slidemo +
                   (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
        uVar4 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_13c);
        bVar6 = true;
        if ((uVar4 == 0) && (bVar6 = false, (i_compatflags & 0x4000000U) != 0)) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_140,
                     (int)this->slidemo + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE)
                    );
          uVar4 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_140);
          bVar6 = uVar4 != 0;
        }
        bVar6 = (bool)(bVar6 ^ 1);
      }
      dVar7 = pos.Z;
      if (bVar6) goto LAB_00675468;
      actor = this->slidemo;
      FPathTraverse::InterceptPoint((FPathTraverse *)&savedz,(intercept_t *)&in);
      P_LineOpening((FLineOpening *)&it.count,actor,(line_t *)dVar7,(DVector2 *)&savedz,
                    (DVector2 *)0x0,0);
      uVar2 = it._56_8_;
      if (((open.bottom < this->slidemo->Height) ||
          (dVar7 = AActor::Top(this->slidemo), (double)uVar2 < dVar7)) ||
         (dVar7 = AActor::Z(this->slidemo), pdVar1 = &this->slidemo->MaxStepHeight,
         *pdVar1 <= open.top - dVar7 && open.top - dVar7 != *pdVar1)) goto LAB_00675468;
      dVar7 = AActor::Z(this->slidemo);
      if (dVar7 < open.top) {
        dVar7 = AActor::Z(this->slidemo);
        AActor::SetZ(this->slidemo,open.top,true);
        bVar6 = P_TestMobjZ(this->slidemo,true,(AActor **)0x0);
        AActor::SetZ(this->slidemo,dVar7,true);
        if (!bVar6) goto LAB_00675468;
      }
    }
    AActor::PosRelative((DVector3 *)local_128,this->slidemo,(line_t *)pos.Z);
    TVector2<double>::TVector2(&local_138,(TVector3<double> *)local_128);
    iVar3 = P_PointOnLineSide(&local_138,(line_t *)pos.Z);
  } while (iVar3 != 0);
LAB_00675468:
  if (piVar5->frac < this->bestSlidefrac) {
    this->secondSlidefrac = this->bestSlidefrac;
    this->secondslideline = this->bestslideline;
    this->bestSlidefrac = piVar5->frac;
    this->bestslideline = (line_t *)pos.Z;
  }
LAB_006754cc:
  FPathTraverse::~FPathTraverse((FPathTraverse *)&in);
  return;
}

Assistant:

void FSlide::SlideTraverse(const DVector2 &start, const DVector2 &end)
{
	FLineOpening open;
	FPathTraverse it(start.X, start.Y, end.X, end.Y, PT_ADDLINES);
	intercept_t *in;

	while ((in = it.Next()))
	{
		line_t* 	li;

		if (!in->isaline)
		{
			// should never happen
			Printf("PTR_SlideTraverse: not a line?");
			continue;
		}

		li = in->d.line;

		if (!(li->flags & ML_TWOSIDED) || !li->backsector)
		{
			DVector3 pos = slidemo->PosRelative(li);
			if (P_PointOnLineSide(pos, li))
			{
				// don't hit the back side
				continue;
			}
			goto isblocking;
		}
		if (li->flags & (ML_BLOCKING | ML_BLOCKEVERYTHING))
		{
			goto isblocking;
		}
		if (li->flags & ML_BLOCK_PLAYERS && slidemo->player != NULL)
		{
			goto isblocking;
		}
		if (li->flags & ML_BLOCKMONSTERS && !((slidemo->flags3 & MF3_NOBLOCKMONST)
			|| ((i_compatflags & COMPATF_NOBLOCKFRIENDS) && (slidemo->flags & MF_FRIENDLY))))
		{
			goto isblocking;
		}

		// set openrange, opentop, openbottom
		P_LineOpening(open, slidemo, li, it.InterceptPoint(in));

		if (open.range < slidemo->Height)
			goto isblocking;				// doesn't fit

		if (open.top < slidemo->Top())
			goto isblocking;				// mobj is too high

		if (open.bottom - slidemo->Z() > slidemo->MaxStepHeight)
		{
			goto isblocking;				// too big a step up
		}
		else if (slidemo->Z() < open.bottom)
		{ // [RH] Check to make sure there's nothing in the way for the step up
			double savedz = slidemo->Z();
			slidemo->SetZ(open.bottom);
			bool good = P_TestMobjZ(slidemo);
			slidemo->SetZ(savedz);
			if (!good)
			{
				goto isblocking;
			}
		}

		// this line doesn't block movement
		continue;

		// the line does block movement,
		// see if it is closer than best so far
	isblocking:
		if (in->frac < bestSlidefrac)
		{
			secondSlidefrac = bestSlidefrac;
			secondslideline = bestslideline;
			bestSlidefrac = in->frac;
			bestslideline = li;
		}

		return;		// stop
	}
}